

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  float32 *pfVar1;
  float32 *pfVar2;
  int iVar3;
  cmd_ln_t *pcVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  uint32 n_SDfeat;
  uint32 n_SDmixw;
  uint32 n_SIdensity;
  uint32 n_SIfeat;
  uint32 n_SImixw;
  float32 ***SDmixw;
  float32 ***SImixw;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  float local_2c;
  double local_28;
  float32 ***local_20;
  float32 ***local_18;
  
  parse_cmd_ln(argc,argv);
  pcVar4 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar4,"-SImixwfn");
  uVar7 = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
          ,0x5a,"Reading %s\n",pcVar5);
  iVar3 = s3mixw_read(pcVar5,&local_18,&local_30,&local_34,&local_38);
  if (iVar3 == 0) {
    printf("SImixw %u %u %u\n",(ulong)local_30,(ulong)local_34,(ulong)local_38);
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-SDmixwfn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
            ,0x67,"Reading %s\n",pcVar5);
    iVar3 = s3mixw_read(pcVar5,&local_20,&local_3c,&local_40,&local_44);
    if (iVar3 == 0) {
      pcVar4 = cmd_ln_get();
      dVar11 = cmd_ln_float_r(pcVar4,"-SIlambda");
      local_2c = (float)dVar11;
      if ((local_2c < 0.0) || (1.0 < local_2c)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
                ,0x73,"silamda value outside range (0,1.0)\n");
        exit(1);
      }
      local_28 = (double)local_2c;
      printf("SDmixw %u %u %u\n",(ulong)local_3c,(ulong)local_40,(ulong)local_44);
      printf("Interpolating with SI weight %f\n",local_28);
      if (((local_30 == local_3c) && (local_34 == local_40)) &&
         (uVar6 = (ulong)local_38, local_38 == local_44)) {
        if ((ulong)local_30 != 0) {
          uVar8 = 0;
          do {
            if ((ulong)local_34 != 0) {
              uVar9 = 0;
              do {
                if (uVar6 != 0) {
                  pfVar1 = local_20[uVar8][uVar9];
                  fVar12 = 0.0;
                  uVar10 = 0;
                  do {
                    fVar12 = fVar12 + (float)pfVar1[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar6 != uVar10);
                  pfVar2 = local_18[uVar8][uVar9];
                  fVar13 = 0.0;
                  uVar10 = 0;
                  do {
                    fVar13 = fVar13 + (float)pfVar2[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar6 != uVar10);
                  uVar10 = 0;
                  do {
                    pfVar1[uVar10] =
                         (float32)((float)pfVar2[uVar10] *
                                   (float)(-(uint)(fVar13 != 0.0) & (uint)(local_2c / fVar13)) +
                                  (float)pfVar1[uVar10] *
                                  (float)(-(uint)(fVar12 != 0.0) &
                                         (uint)(float)((1.0 - local_28) / (double)fVar12)));
                    uVar10 = uVar10 + 1;
                  } while (uVar6 != uVar10);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != local_34);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != local_30);
        }
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-outmixwfn");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
                ,0x9a,"Writing %s\n",pcVar5);
        iVar3 = s3mixw_write(pcVar5,local_20,local_3c,local_40,local_44);
        uVar7 = (uint)(iVar3 != 0);
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mixw_interp/main.c"
                ,0x7a,"Mixing weight files are not compatible.\n");
      }
    }
  }
  return uVar7;
}

Assistant:

static int
initialize(int argc,
	   char *argv[])
{

    /* define, parse and (partially) validate the command line */
    parse_cmd_ln(argc, argv);

    return S3_SUCCESS;
}